

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  uint16_t *puVar2;
  _Bool _Var3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  array_container_t *container;
  uint8_t uVar8;
  uint uVar9;
  ushort *buf_00;
  uint uVar10;
  uint uVar11;
  int32_t cardinality;
  char *pcVar12;
  char *pcVar13;
  
  *readbytes = 4;
  if (3 < maxbytes) {
    uVar10 = *(uint *)buf;
    uVar9 = uVar10 & 0xffff;
    if (uVar10 == 0x303a || uVar9 == 0x303b) {
      if (uVar9 == 0x303b) {
        uVar7 = (ulong)((uVar10 >> 0x10) + 8 >> 3);
        uVar5 = uVar7 + 4;
        *readbytes = uVar5;
        if (maxbytes < uVar5) {
          return false;
        }
        pcVar13 = buf + 4;
        uVar10 = (uVar10 >> 0x10) + 1;
        pcVar12 = pcVar13 + uVar7;
      }
      else {
        *readbytes = 8;
        if (maxbytes < 8) {
          return false;
        }
        uVar10 = *(uint *)(buf + 4);
        if (0x10000 < uVar10) {
          return false;
        }
        pcVar12 = buf + 8;
        uVar5 = 8;
        pcVar13 = (char *)0x0;
      }
      uVar7 = (ulong)(uVar10 * 4);
      *readbytes = uVar5 + uVar7;
      if ((uVar5 + uVar7 <= maxbytes) && (_Var3 = ra_init_with_capacity(answer,uVar10), _Var3)) {
        if (uVar10 != 0) {
          puVar2 = answer->keys;
          uVar5 = 0;
          do {
            puVar2[uVar5] = *(uint16_t *)(pcVar12 + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar10 != uVar5);
        }
        buf_00 = (ushort *)(pcVar12 + uVar7);
        if ((uVar9 != 0x303b) || (3 < (int)uVar10)) {
          sVar6 = *readbytes;
          *readbytes = sVar6 + uVar7;
          if (maxbytes < sVar6 + uVar7) {
LAB_0010da25:
            ra_clear(answer);
            return false;
          }
          buf_00 = (ushort *)((long)buf_00 + uVar7);
        }
        if ((int)uVar10 < 1) {
          return true;
        }
        uVar5 = 0;
        while( true ) {
          uVar1 = *(ushort *)(pcVar12 + uVar5 * 4 + 2);
          cardinality = (int32_t)((ulong)uVar1 + 1);
          if (uVar9 != 0x303b) break;
          sVar6 = *readbytes;
          uVar11 = 1 << ((byte)uVar5 & 7) & (uint)(byte)pcVar13[uVar5 >> 3 & 0x1fffffff];
          if ((uVar11 == 0) && (0xfff < uVar1)) {
LAB_0010d8f8:
            *readbytes = sVar6 + 0x2000;
            if (maxbytes < sVar6 + 0x2000) goto LAB_0010da00;
            container = (array_container_t *)bitset_container_create();
            if (container == (array_container_t *)0x0) goto LAB_0010da25;
            answer->size = answer->size + 1;
            iVar4 = bitset_container_read
                              (cardinality,(bitset_container_t *)container,(char *)buf_00);
            uVar8 = '\x01';
          }
          else {
            if (uVar11 == 0) goto LAB_0010d991;
            uVar7 = sVar6 + 2;
            *readbytes = uVar7;
            if (maxbytes < uVar7) goto LAB_0010da00;
            uVar7 = uVar7 + (ulong)*buf_00 * 4;
            *readbytes = uVar7;
            if ((maxbytes < uVar7) ||
               (container = (array_container_t *)run_container_create(),
               container == (array_container_t *)0x0)) goto LAB_0010da25;
            answer->size = answer->size + 1;
            iVar4 = run_container_read(cardinality,(run_container_t *)container,(char *)buf_00);
            uVar8 = '\x03';
          }
LAB_0010d9c7:
          buf_00 = (ushort *)((long)buf_00 + (long)iVar4);
          answer->containers[uVar5] = container;
          answer->typecodes[uVar5] = uVar8;
          uVar5 = uVar5 + 1;
          if (uVar10 == uVar5) {
            return true;
          }
        }
        sVar6 = *readbytes;
        if (0xfff < uVar1) goto LAB_0010d8f8;
LAB_0010d991:
        uVar7 = sVar6 + ((ulong)uVar1 + 1) * 2;
        *readbytes = uVar7;
        if (uVar7 <= maxbytes) {
          container = array_container_create_given_capacity(cardinality);
          if (container != (array_container_t *)0x0) {
            answer->size = answer->size + 1;
            iVar4 = array_container_read(cardinality,container,(char *)buf_00);
            uVar8 = '\x02';
            goto LAB_0010d9c7;
          }
          goto LAB_0010da25;
        }
LAB_0010da00:
        ra_clear_containers(answer);
        roaring_free(answer->containers);
        answer->keys = (uint16_t *)0x0;
        answer->typecodes = (uint8_t *)0x0;
        answer->size = 0;
        answer->allocation_size = 0;
        answer->containers = (void **)0x0;
      }
    }
  }
  return false;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf,
                             const size_t maxbytes, size_t *readbytes) {
    *readbytes = sizeof(int32_t);  // for cookie
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading first 4 bytes.
        return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        // "I failed to find one of the right cookies.
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if (*readbytes > maxbytes) {
            // Ran out of bytes while reading second part of the cookie.
            return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size < 0) {
        // You cannot have a negative number of containers, the data must be
        // corrupted.
        return false;
    }
    if (size > (1 << 16)) {
        // You cannot have so many containers, the data must be corrupted.
        return false;
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading run bitmap.
            return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading key-cardinality array.
        return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        // Failed to allocate memory for roaring array. Bailing out.
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading offsets.
            ra_clear(answer);  // we need to clear the containers already
                               // allocated, and the roaring array
            return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a run container (header).
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}